

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerMSL::SampledImageScanner::handle
          (SampledImageScanner *this,Op opcode,uint32_t *args,uint32_t length)

{
  CompilerMSL *this_00;
  SPIRType *type_00;
  byte local_61;
  bool local_51;
  bool local_3d;
  uint32_t local_3c;
  SPIRType *pSStack_38;
  uint32_t id;
  SPIRType *type;
  uint32_t result_type;
  uint32_t length_local;
  uint32_t *args_local;
  SampledImageScanner *pSStack_18;
  Op opcode_local;
  SampledImageScanner *this_local;
  
  type._4_4_ = length;
  _result_type = args;
  args_local._4_4_ = opcode;
  pSStack_18 = this;
  if ((opcode != OpLoad) && (opcode != OpSampledImage)) {
    if (opcode - OpImageSampleImplicitLod < 0xb) {
      local_51 = true;
      if ((this->compiler->has_sampled_images & 1U) == 0) {
        this_00 = this->compiler;
        type_00 = Compiler::expression_type((Compiler *)this->compiler,args[2]);
        local_51 = Compiler::is_sampled_image_type((Compiler *)this_00,type_00);
      }
      this->compiler->has_sampled_images = local_51;
      local_61 = 1;
      if ((this->compiler->needs_swizzle_buffer_def & 1U) == 0) {
        local_61 = this->compiler->has_sampled_images;
      }
      this->compiler->needs_swizzle_buffer_def = (bool)(local_61 & 1);
      return true;
    }
    if (opcode != OpImage) {
      return true;
    }
  }
  if (length < 3) {
    return false;
  }
  type._0_4_ = *args;
  pSStack_38 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this->compiler,(uint32_t)type);
  if (((*(int *)&(pSStack_38->super_IVariant).field_0xc == 0x10) ||
      (*(int *)&(pSStack_38->super_IVariant).field_0xc == 0x11)) &&
     ((pSStack_38->image).sampled == 1)) {
    local_3c = _result_type[1];
    local_3d = true;
    Compiler::set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int&,bool>
              ((Compiler *)this->compiler,local_3c,(char (*) [1])0x5df766,(uint *)&type,&local_3d);
    return true;
  }
  return true;
}

Assistant:

bool CompilerMSL::SampledImageScanner::handle(spv::Op opcode, const uint32_t *args, uint32_t length)
{
	switch (opcode)
	{
	case OpLoad:
	case OpImage:
	case OpSampledImage:
	{
		if (length < 3)
			return false;

		uint32_t result_type = args[0];
		auto &type = compiler.get<SPIRType>(result_type);
		if ((type.basetype != SPIRType::Image && type.basetype != SPIRType::SampledImage) || type.image.sampled != 1)
			return true;

		uint32_t id = args[1];
		compiler.set<SPIRExpression>(id, "", result_type, true);
		break;
	}
	case OpImageSampleExplicitLod:
	case OpImageSampleProjExplicitLod:
	case OpImageSampleDrefExplicitLod:
	case OpImageSampleProjDrefExplicitLod:
	case OpImageSampleImplicitLod:
	case OpImageSampleProjImplicitLod:
	case OpImageSampleDrefImplicitLod:
	case OpImageSampleProjDrefImplicitLod:
	case OpImageFetch:
	case OpImageGather:
	case OpImageDrefGather:
		compiler.has_sampled_images =
		    compiler.has_sampled_images || compiler.is_sampled_image_type(compiler.expression_type(args[2]));
		compiler.needs_swizzle_buffer_def = compiler.needs_swizzle_buffer_def || compiler.has_sampled_images;
		break;
	default:
		break;
	}
	return true;
}